

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O0

bool jessilib::apply_cpp_escape_sequences<char8_t>
               (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                *inout_string)

{
  bool bVar1;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *inout_string_local;
  
  bVar1 = apply_shrink_sequence_tree<char8_t,_jessilib::cpp_escapes_root_tree,_1UL>(inout_string);
  return bVar1;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}